

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

void rawEnumerate(FILE *outf,char *groupname,dotNode *(*results) [7],int method,int nsel,int spike,
                 int outdots,int numSkinDots,float density,char *namestring,char *rawname,
                 double scoreBias)

{
  float fVar1;
  char cVar2;
  dotNode *pdVar3;
  long lVar4;
  dotNode_t *pdVar5;
  ulong uVar6;
  float fVar7;
  double dVar8;
  float fVar9;
  float fVar10;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  
  if (0 < numSkinDots && 0 < nsel) {
    local_98 = 0.0;
    local_90 = 0.0;
    local_94 = 0.0;
    local_8c = 0.0;
    for (lVar4 = 0; lVar4 != 0x72; lVar4 = lVar4 + 1) {
      for (uVar6 = 0; uVar6 != 7; uVar6 = uVar6 + 1) {
        pdVar3 = results[lVar4][uVar6];
        fVar10 = 0.0;
        local_88 = 0.0;
        local_84 = 0.0;
        fVar9 = 0.0;
        for (pdVar5 = pdVar3; pdVar5 != (dotNode *)0x0; pdVar5 = pdVar5->next) {
          if (spike == 0) {
            fVar10 = fVar10 + 1.0;
          }
          else {
            if (uVar6 < 3) {
              fVar10 = fVar10 + 1.0;
              dVar8 = (double)(pdVar5->gap / GAPweight);
              dVar8 = exp(-dVar8 * dVar8);
            }
            else {
              fVar1 = pdVar5->gap;
              fVar7 = -fVar1;
              if (-fVar1 <= fVar1) {
                fVar7 = fVar1;
              }
              if ((int)uVar6 - 3U < 3) {
                local_84 = local_84 + 1.0;
                fVar9 = fVar9 - (float)((double)fVar7 * 0.5 * (double)BUMPweight);
                goto LAB_0012bb43;
              }
              local_88 = local_88 + 1.0;
              dVar8 = (double)fVar7 * 0.5 * (double)HBweight;
            }
            fVar9 = fVar9 + (float)dVar8;
          }
LAB_0012bb43:
        }
        if (pdVar3 != (dotNode *)0x0) {
          local_98 = local_98 + fVar10;
          local_90 = local_90 + local_88;
          local_94 = local_94 + local_84;
          local_8c = local_8c + fVar9;
        }
      }
    }
    if (method == 0) {
      dVar8 = (double)((local_90 + local_98 + local_94) / density);
    }
    else {
      if (spike != 0) {
        local_98 = local_8c / density;
      }
      dVar8 = (double)local_98 + scoreBias;
    }
    fprintf((FILE *)outf,"%9.3f",dVar8);
    cVar2 = *rawname;
    goto joined_r0x0012bc54;
  }
  if (method == 0) {
    scoreBias = 0.0;
LAB_0012bbd7:
    fprintf((FILE *)outf,"%9.3f",scoreBias);
  }
  else if (spike != 0) goto LAB_0012bbd7;
  cVar2 = *rawname;
joined_r0x0012bc54:
  if (cVar2 != '\0') {
    fprintf((FILE *)outf," %s",rawname);
  }
  if ((*namestring != '\0') || (*groupname != '\0')) {
    fputs("#",(FILE *)outf);
    if (*namestring != '\0') {
      fprintf((FILE *)outf," %s",namestring);
    }
    if (*groupname != '\0') {
      fprintf((FILE *)outf," %s",groupname);
    }
  }
  fputc(10,(FILE *)outf);
  return;
}

Assistant:

void rawEnumerate(FILE *outf, char* groupname, dotNode *results[][NODEWIDTH],
               int method, int nsel, int spike, int outdots, int numSkinDots,
	       float density, char *namestring, char *rawname, double scoreBias)
{/*rawEnumerate*/
   int i, j, doit;
   float gs, hs, bs, hslen, bslen, tgs, ths, tbs, thslen, tbslen;
   float dtgp, score, tGscore, tHscore, tBscore, tscore, scoreValue;
   double scaledGap, slen;
   dotNode *node;

   /*autobondrot: countDots==1, rawOutput==1  */
   /*  *rawname holds autobondrot angle values as space_char deliniated string*/

   if (nsel <= 0 || numSkinDots <= 0) { /* empty selection */
      if (method == EXTERNALSURFACE) {
	 fprintf(outf, "%9.3f", 0.0);
      }
      else if (spike) {
	 fprintf(outf, "%9.3f", scoreBias);
      }

      if (*rawname) { fprintf(outf, " %s", rawname); }
      if (*namestring || *groupname) {
	 fprintf(outf, "%s", RAW_HEADER_COMMENT);
	 if (*namestring) { fprintf(outf, " %s", namestring); }
	 if (*groupname)  { fprintf(outf, " %s", groupname);  }
      }
      fprintf(outf, "\n");
      return;
   }

   tgs = ths = thslen = tbs = tbslen = 0.0;
   tGscore = tHscore = tBscore = tscore = 0.0;
   for (i = 0; i < NUMATOMTYPES; i++) {
   for (j = 0; j < NODEWIDTH; j++)
   {
      gs = hs = hslen = bs = bslen = score = 0.0;
      node = results[i][j];
      doit = (node != NULL);
      while(node)
      {
         if (spike)/* 04/10/2015 SJ changed the if statements in this block to reflect change in dots ordering, see NODEWIDTH in probe.h*/
         {
            // if (j == 0 || j == 1) { /* contact dot */
             if(j ==0 || j ==1 || j ==2){ /* contacts, and weak H bonds*/
                 gs += 1.0;
                 dtgp = node->gap;
                 scaledGap = dtgp/GAPweight;
                 scoreValue = exp(-scaledGap*scaledGap);
                 score   += scoreValue;
                 tGscore += scoreValue;
             }
            // else if (j == 2 || j == 3) { /* bump */
             else if(j ==3 || j ==4 || j ==5){ /* bump */
                 bs += 1.0;
                 slen = 0.5*FABS(node->gap);
                 bslen += slen;
                 scoreValue = - BUMPweight * slen;
                 score   += scoreValue;
                 tBscore += scoreValue;
             }
             else { /* H-bond */
                 hs += 1.0;
                 slen = 0.5*FABS(node->gap);
                 hslen += slen;
                 scoreValue = HBweight * slen;
                 score   += scoreValue;
                 tHscore += scoreValue;
             }
         }
         else {
             gs += 1.0;
         }
         node = node->next;
      }
      if (doit) {
         tgs += gs;
         ths += hs;
         thslen += hslen;
         tbs += bs;
         tbslen += bslen;
         tscore += score;
      }
   }
   }

   /*output one line of information */
   if (method == EXTERNALSURFACE) {
      fprintf(outf, "%9.3f", (tgs+tbs+ths)/density);
   }
   else if (spike) /*autobondrot: spike==1 at least in all examples dcr tested*/
   {
      fprintf(outf, "%9.3f", scoreBias + (tscore/density));  /*value # ...*/
   }
   else {
      fprintf(outf, "%9.3f", scoreBias + tgs);
   }
   if (*rawname) { fprintf(outf, " %s", rawname); } /*autobondrot angle values*/
   if (*namestring || *groupname) {
      fprintf(outf, "%s", RAW_HEADER_COMMENT);
      if (*namestring) { fprintf(outf, " %s", namestring); }
      if (*groupname)  { fprintf(outf, " %s", groupname);  }
   }
   fprintf(outf, "\n"); /* NOTE this is the LF for above print statements*/

   /* char* rawname == buf that is filled in autobondrot.c/runnameAndTorsion()*/
   /* contains the autobondrot angle values in the order in which processed*/

}